

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildFileGenerator::GenerateImportTargetsConfig
          (cmExportBuildFileGenerator *this,ostream *os,string *config,string *suffix)

{
  cmGeneratorTarget *headTarget;
  bool bVar1;
  TargetType TVar2;
  reference pTVar3;
  ulong uVar4;
  cmLocalGenerator *lg;
  string *a;
  char local_151;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [8];
  string importedXcFrameworkLocation;
  undefined1 local_80 [8];
  ImportPropertyMap properties;
  cmGeneratorTarget *target;
  TargetExportPrivate *exp;
  iterator __end1;
  iterator __begin1;
  vector<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>
  *__range1;
  string *suffix_local;
  string *config_local;
  ostream *os_local;
  cmExportBuildFileGenerator *this_local;
  
  __end1 = std::
           vector<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>
           ::begin(&this->Exports);
  exp = (TargetExportPrivate *)
        std::
        vector<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>
        ::end(&this->Exports);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmExportBuildFileGenerator::TargetExportPrivate_*,_std::vector<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>_>
                                     *)&exp), bVar1) {
    pTVar3 = __gnu_cxx::
             __normal_iterator<cmExportBuildFileGenerator::TargetExportPrivate_*,_std::vector<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>_>
             ::operator*(&__end1);
    properties._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pTVar3->Target;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_80);
    TVar2 = GetExportTargetType(this,(cmGeneratorTarget *)
                                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (TVar2 != INTERFACE_LIBRARY) {
      SetImportLocationProperty
                (this,config,suffix,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (ImportPropertyMap *)local_80);
    }
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_80);
    if (!bVar1) {
      TVar2 = GetExportTargetType(this,(cmGeneratorTarget *)
                                       properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (TVar2 != INTERFACE_LIBRARY) {
        cmExportFileGenerator::SetImportDetailProperties
                  (&this->super_cmExportFileGenerator,config,suffix,
                   (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (ImportPropertyMap *)local_80);
        cmExportFileGenerator::SetImportLinkInterface
                  (&this->super_cmExportFileGenerator,config,suffix,BuildInterface,
                   (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (ImportPropertyMap *)local_80);
      }
      std::__cxx11::string::string((string *)local_b0,(string *)&pTVar3->XcFrameworkLocation);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        cmGeneratorExpression::Preprocess(&local_d0,(string *)local_b0,BuildInterface,false);
        std::__cxx11::string::operator=((string *)local_b0,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::string((string *)&local_110,(string *)local_b0);
        lg = cmGeneratorTarget::GetLocalGenerator(pTVar3->Target);
        headTarget = pTVar3->Target;
        std::__cxx11::string::string((string *)&local_130);
        cmGeneratorExpression::Evaluate
                  (&local_f0,&local_110,lg,config,headTarget,(cmGeneratorExpressionDAGChecker *)0x0,
                   headTarget,&local_130);
        std::__cxx11::string::operator=((string *)local_b0,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
        uVar4 = std::__cxx11::string::empty();
        if (((uVar4 & 1) == 0) &&
           (bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_b0), !bVar1)) {
          a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LG);
          local_151 = '/';
          cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                    (&local_150,a,&local_151,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
          std::__cxx11::string::operator=((string *)local_b0,(string *)&local_150);
          std::__cxx11::string::~string((string *)&local_150);
        }
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                (this,os,config,suffix,properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 local_80,local_b0);
      std::__cxx11::string::~string((string *)local_b0);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_80);
    __gnu_cxx::
    __normal_iterator<cmExportBuildFileGenerator::TargetExportPrivate_*,_std::vector<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix)
{
  for (auto const& exp : this->Exports) {
    cmGeneratorTarget* target = exp.Target;

    // Collect import properties for this target.
    ImportPropertyMap properties;

    if (this->GetExportTargetType(target) != cmStateEnums::INTERFACE_LIBRARY) {
      this->SetImportLocationProperty(config, suffix, target, properties);
    }
    if (!properties.empty()) {
      // Get the rest of the target details.
      if (this->GetExportTargetType(target) !=
          cmStateEnums::INTERFACE_LIBRARY) {
        this->SetImportDetailProperties(config, suffix, target, properties);
        this->SetImportLinkInterface(config, suffix,
                                     cmGeneratorExpression::BuildInterface,
                                     target, properties);
      }

      // TODO: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      std::string importedXcFrameworkLocation = exp.XcFrameworkLocation;
      if (!importedXcFrameworkLocation.empty()) {
        importedXcFrameworkLocation = cmGeneratorExpression::Preprocess(
          importedXcFrameworkLocation,
          cmGeneratorExpression::PreprocessContext::BuildInterface);
        importedXcFrameworkLocation = cmGeneratorExpression::Evaluate(
          importedXcFrameworkLocation, exp.Target->GetLocalGenerator(), config,
          exp.Target, nullptr, exp.Target);
        if (!importedXcFrameworkLocation.empty() &&
            !cmSystemTools::FileIsFullPath(importedXcFrameworkLocation)) {
          importedXcFrameworkLocation =
            cmStrCat(this->LG->GetCurrentBinaryDirectory(), '/',
                     importedXcFrameworkLocation);
        }
      }
      this->GenerateImportPropertyCode(os, config, suffix, target, properties,
                                       importedXcFrameworkLocation);
    }
  }
}